

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ktx::convertUNORMSBits<ImageT<unsigned_short,2u>>
          (unique_ptr<Image,_std::default_delete<Image>_> *image,uint32_t sBits,string_view swizzle)

{
  bool bVar1;
  pointer pIVar2;
  size_t in_RCX;
  uint in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  char *in_R8;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_len = in_RCX;
  local_18._M_str = in_R8;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    pIVar2 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                       ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1eeba0);
    (*pIVar2->_vptr_Image[0x15])(pIVar2,local_18._M_len,local_18._M_str);
  }
  pIVar2 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                     ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1eebd4);
  (*pIVar2->_vptr_Image[8])(in_RDI,pIVar2,2,0x10,(ulong)in_EDX);
  return in_RDI;
}

Assistant:

std::vector<uint8_t> convertUNORMSBits(const std::unique_ptr<Image>& image, uint32_t sBits, std::string_view swizzle = "") {
    using ComponentT = typename T::Color::value_type;
    static constexpr auto componentCount = T::Color::getComponentCount();
    static constexpr auto bytesPerComponent = sizeof(ComponentT);
    static constexpr auto bits = bytesPerComponent * 8;

    if (!swizzle.empty())
        image->swizzle(swizzle);

    return image->getUNORM(componentCount, bits, sBits);
}